

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_LongLongIntegerReturnValue_Test::testBody
          (TEST_MockReturnValueTest_LongLongIntegerReturnValue_Test *this)

{
  undefined8 uVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  cpputest_longlong cVar5;
  TestTerminator *pTVar6;
  undefined8 uVar7;
  undefined4 extraout_var_01;
  SimpleString local_130;
  SimpleString local_120;
  MockNamedValue local_110;
  MockNamedValue local_c0;
  SimpleString local_70;
  SimpleString local_60;
  long *local_50;
  MockActualCall *actual_call;
  SimpleString local_28;
  undefined8 local_18;
  longlong expected_value;
  TEST_MockReturnValueTest_LongLongIntegerReturnValue_Test *this_local;
  
  local_18 = 7;
  expected_value = (longlong)this;
  SimpleString::SimpleString(&local_28,"");
  pMVar3 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&actual_call,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&actual_call);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xe8))
            ((long *)CONCAT44(extraout_var,iVar2),local_18);
  SimpleString::~SimpleString((SimpleString *)&actual_call);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_60,"");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_70);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  local_50 = (long *)CONCAT44(extraout_var_00,iVar2);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  (**(code **)(*local_50 + 0xa8))();
  cVar5 = MockNamedValue::getLongLongIntValue(&local_c0);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x10])
            (pUVar4,uVar1,cVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x211,pTVar6);
  MockNamedValue::~MockNamedValue(&local_c0);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  uVar7 = (**(code **)(*local_50 + 0x100))();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x10])
            (pUVar4,uVar1,uVar7,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x212,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  SimpleString::SimpleString(&local_120,"");
  pMVar3 = mock(&local_120,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[8])(&local_110);
  cVar5 = MockNamedValue::getLongLongIntValue(&local_110);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x10])
            (pUVar4,uVar1,cVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x213,pTVar6);
  MockNamedValue::~MockNamedValue(&local_110);
  SimpleString::~SimpleString(&local_120);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  SimpleString::SimpleString(&local_130,"");
  pMVar3 = mock(&local_130,(MockFailureReporter *)0x0);
  iVar2 = (*pMVar3->_vptr_MockSupport[0x12])();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x10])
            (pUVar4,uVar1,CONCAT44(extraout_var_01,iVar2),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x214,pTVar6);
  SimpleString::~SimpleString(&local_130);
  return;
}

Assistant:

TEST(MockReturnValueTest, LongLongIntegerReturnValue)
{
    long long int expected_value = 7;
    mock().expectOneCall("foo").andReturnValue(expected_value);

    MockActualCall& actual_call = mock().actualCall("foo");
    LONGLONGS_EQUAL(expected_value, actual_call.returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(expected_value, actual_call.returnLongLongIntValue());
    LONGLONGS_EQUAL(expected_value, mock().returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(expected_value, mock().longLongIntReturnValue());
}